

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O0

bool __thiscall trun::DynLibLinux::Scan(DynLibLinux *this,string *libPathName)

{
  bool bVar1;
  string *libPathName_local;
  DynLibLinux *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->pathName,libPathName);
  gnilk::Log::Debug<char_const*>(this->pLogger,"Scan, entering");
  bVar1 = Open(this);
  if (bVar1) {
    gnilk::Log::Debug<char_const*>(this->pLogger,"Scan, leaving");
  }
  else {
    gnilk::Log::Debug<char_const*>(this->pLogger,"Open failed");
  }
  return bVar1;
}

Assistant:

bool DynLibLinux::Scan(const std::string &libPathName) {
    pathName = libPathName;

    pLogger->Debug("Scan, entering");
    if (!Open()) {
        pLogger->Debug("Open failed");
        return false;
    }

    pLogger->Debug("Scan, leaving");
    return true;
}